

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_cfdata_deflate(archive_read *a,ssize_t *avail)

{
  char cVar1;
  ushort uVar2;
  size_t __size;
  wchar_t wVar3;
  uchar *puVar4;
  int64_t iVar5;
  bool bVar6;
  long local_58;
  ssize_t bytes_avail_1;
  ssize_t bytes_avail;
  int local_40;
  char eod;
  uint uStack_3c;
  uint16_t uavail;
  wchar_t mszip;
  wchar_t r;
  void *d;
  cfdata *cfdata;
  cab *cab;
  ssize_t *avail_local;
  archive_read *a_local;
  
  cfdata = (cfdata *)a->format->data;
  bytes_avail._5_1_ = 0;
  d = cfdata->sum_ptr;
  cab = (cab *)avail;
  avail_local = (ssize_t *)a;
  if (cfdata[2].memimage == (uchar *)0x0) {
    cfdata[2].sum_calculated = 0x8000;
    cfdata[2].sum_extra[0] = '\0';
    cfdata[2].sum_extra[1] = '\0';
    cfdata[2].sum_extra[2] = '\0';
    cfdata[2].sum_extra[3] = '\0';
    __size._0_4_ = cfdata[2].sum_calculated;
    __size._4_1_ = cfdata[2].sum_extra[0];
    __size._5_1_ = cfdata[2].sum_extra[1];
    __size._6_1_ = cfdata[2].sum_extra[2];
    __size._7_1_ = cfdata[2].sum_extra[3];
    puVar4 = (uchar *)malloc(__size);
    cfdata[2].memimage = puVar4;
    if (cfdata[2].memimage == (uchar *)0x0) {
      archive_set_error((archive *)avail_local,0xc,"No memory for CAB reader");
      cab->entry_offset = -0x1e;
      return (void *)0x0;
    }
  }
  bytes_avail._6_2_ = *(ushort *)((long)d + 0xc);
  if (bytes_avail._6_2_ == *(ushort *)((long)d + 8)) {
    a_local = (archive_read *)(cfdata[2].memimage + (int)(uint)*(ushort *)((long)d + 0xe));
    cab->entry_offset = (long)(int)((uint)bytes_avail._6_2_ - (uint)*(ushort *)((long)d + 0xe));
  }
  else {
    if (*(char *)(*(long *)&cfdata->sum_calculated + 0x5c) == '\0') {
      cfdata[4].unconsumed = 0;
      *(undefined4 *)&cfdata[4].memimage_size = 0;
      cfdata[4].memimage = (uchar *)0x0;
      cfdata[4].sum_calculated = 0;
      cfdata[4].sum_extra[0] = '\0';
      cfdata[4].sum_extra[1] = '\0';
      cfdata[4].sum_extra[2] = '\0';
      cfdata[4].sum_extra[3] = '\0';
      cfdata[4].sum_extra_avail = 0;
      cfdata[4].sum_ptr = (void *)0x0;
      if ((char)cfdata[6].sum == '\0') {
        uStack_3c = cm_zlib_inflateInit2_((z_streamp)&cfdata[4].unconsumed,-0xf,"1.3.1",0x70);
      }
      else {
        uStack_3c = cm_zlib_inflateReset((z_streamp)&cfdata[4].unconsumed);
      }
      if (uStack_3c != 0) {
        archive_set_error((archive *)avail_local,-1,"Can\'t initialize deflate decompression.");
        cab->entry_offset = -0x1e;
        return (void *)0x0;
      }
      *(undefined1 *)&cfdata[6].sum = 1;
      *(undefined1 *)(*(long *)&cfdata->sum_calculated + 0x5c) = 1;
    }
    if (*(short *)((long)d + 6) == *(short *)((long)d + 4)) {
      local_40 = 2;
    }
    else {
      local_40 = 0;
    }
    bytes_avail._5_1_ = '\0';
    cfdata[4].sum_ptr = (void *)(ulong)bytes_avail._6_2_;
LAB_0018fedf:
    do {
      bVar6 = false;
      if (bytes_avail._5_1_ == '\0') {
        bVar6 = cfdata[4].sum_ptr < (void *)(ulong)*(ushort *)((long)d + 8);
      }
      if (!bVar6) {
        bytes_avail._6_2_ = (ushort)cfdata[4].sum_ptr;
        if (bytes_avail._6_2_ < *(ushort *)((long)d + 8)) {
          archive_set_error((archive *)avail_local,-1,"Invalid uncompressed size (%d < %d)",
                            (ulong)cfdata[4].sum_ptr & 0xffff,(ulong)*(ushort *)((long)d + 8));
          cab->entry_offset = -0x1e;
          return (void *)0x0;
        }
        if (*(short *)((long)d + 6) != 0) {
          _mszip = __archive_read_ahead
                             ((archive_read *)avail_local,(ulong)*(ushort *)((long)d + 6),&local_58)
          ;
          if (local_58 < 1) {
            wVar3 = truncated_error((archive_read *)avail_local);
            cab->entry_offset = (long)wVar3;
            return (void *)0x0;
          }
          *(ulong *)((long)d + 0x10) = (ulong)*(ushort *)((long)d + 6);
          *(void **)((long)d + 0x38) = _mszip;
          iVar5 = cab_minimum_consume_cfdata
                            ((archive_read *)avail_local,*(int64_t *)((long)d + 0x10));
          if (iVar5 < 0) {
            cab->entry_offset = -0x1e;
            return (void *)0x0;
          }
        }
        if (((int)(uint)*(ushort *)(*(long *)&cfdata->sum_calculated + 4) <=
             *(int *)(*(long *)&cfdata->sum_calculated + 0x58)) ||
           ((uStack_3c = cm_zlib_inflateReset((z_streamp)&cfdata[4].unconsumed), uStack_3c == 0 &&
            (uStack_3c = cm_zlib_inflateSetDictionary
                                   ((z_streamp)&cfdata[4].unconsumed,cfdata[2].memimage,
                                    (uint)*(ushort *)((long)d + 8)), uStack_3c == 0)))) {
          puVar4 = cfdata[2].memimage;
          uVar2 = *(ushort *)((long)d + 0xe);
          cab->entry_offset =
               (long)(int)((uint)bytes_avail._6_2_ - (uint)*(ushort *)((long)d + 0xe));
          *(ushort *)((long)d + 0xc) = bytes_avail._6_2_;
          return puVar4 + (int)(uint)uVar2;
        }
        goto LAB_0019038d;
      }
      *(uchar **)&cfdata[4].sum_calculated = cfdata[2].memimage + (long)cfdata[4].sum_ptr;
      cfdata[4].sum_extra_avail = (uint)*(ushort *)((long)d + 8) - (int)cfdata[4].sum_ptr;
      _mszip = __archive_read_ahead((archive_read *)avail_local,1,&bytes_avail_1);
      if (bytes_avail_1 < 1) {
        wVar3 = truncated_error((archive_read *)avail_local);
        cab->entry_offset = (long)wVar3;
        return (void *)0x0;
      }
      if ((long)(ulong)*(ushort *)((long)d + 6) < bytes_avail_1) {
        bytes_avail_1 = (ssize_t)*(ushort *)((long)d + 6);
      }
      cfdata[4].unconsumed = (int64_t)_mszip;
      *(int *)&cfdata[4].memimage_size = (int)bytes_avail_1;
      cfdata[4].memimage = (uchar *)0x0;
      if (0 < local_40) {
        if (bytes_avail_1 < 1) goto LAB_001903df;
        if (bytes_avail_1 <= local_40) {
          if (local_40 == 2) {
            if (*(char *)cfdata[4].unconsumed != 'C') goto LAB_001903df;
            if (1 < bytes_avail_1) {
              cVar1 = *(char *)(cfdata[4].unconsumed + 1);
              goto joined_r0x00190052;
            }
          }
          else {
            cVar1 = *(char *)cfdata[4].unconsumed;
joined_r0x00190052:
            if (cVar1 != 'K') {
LAB_001903df:
              archive_set_error((archive *)avail_local,-1,"CFDATA incorrect(no MSZIP signature)");
              cab->entry_offset = -0x1e;
              return (void *)0x0;
            }
          }
          *(ssize_t *)((long)d + 0x10) = bytes_avail_1;
          *(void **)((long)d + 0x38) = _mszip;
          iVar5 = cab_minimum_consume_cfdata
                            ((archive_read *)avail_local,*(int64_t *)((long)d + 0x10));
          if (iVar5 < 0) {
            cab->entry_offset = -0x1e;
            return (void *)0x0;
          }
          local_40 = local_40 - (int)bytes_avail_1;
          goto LAB_0018fedf;
        }
        if (((local_40 == 1) && (*(char *)cfdata[4].unconsumed != 'K')) ||
           ((local_40 == 2 &&
            ((*(char *)cfdata[4].unconsumed != 'C' || (*(char *)(cfdata[4].unconsumed + 1) != 'K')))
            ))) goto LAB_001903df;
        cfdata[4].unconsumed = cfdata[4].unconsumed + (long)local_40;
        *(int *)&cfdata[4].memimage_size = (int)cfdata[4].memimage_size - local_40;
        cfdata[4].memimage = cfdata[4].memimage + local_40;
        local_40 = 0;
      }
      uStack_3c = cm_zlib_inflate((z_streamp)&cfdata[4].unconsumed,0);
      if (uStack_3c != 0) {
        if (uStack_3c != 1) {
LAB_0019038d:
          if (uStack_3c == 0xfffffffc) {
            archive_set_error((archive *)avail_local,0xc,"Out of memory for deflate decompression");
          }
          else {
            archive_set_error((archive *)avail_local,-1,"Deflate decompression failed (%d)",
                              (ulong)uStack_3c);
          }
          cab->entry_offset = -0x1e;
          return (void *)0x0;
        }
        bytes_avail._5_1_ = '\x01';
      }
      *(uchar **)((long)d + 0x10) = cfdata[4].memimage;
      *(void **)((long)d + 0x38) = _mszip;
      iVar5 = cab_minimum_consume_cfdata((archive_read *)avail_local,*(int64_t *)((long)d + 0x10));
    } while (-1 < iVar5);
    cab->entry_offset = -0x1e;
    a_local = (archive_read *)0x0;
  }
  return a_local;
}

Assistant:

static const void *
cab_read_ahead_cfdata_deflate(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	const void *d;
	int r, mszip;
	uint16_t uavail;
	char eod = 0;

	cfdata = cab->entry_cfdata;
	/* If the buffer hasn't been allocated, allocate it now. */
	if (cab->uncompressed_buffer == NULL) {
		cab->uncompressed_buffer_size = 0x8000;
		cab->uncompressed_buffer
		    = (unsigned char *)malloc(cab->uncompressed_buffer_size);
		if (cab->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for CAB reader");
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}

	uavail = cfdata->uncompressed_avail;
	if (uavail == cfdata->uncompressed_size) {
		d = cab->uncompressed_buffer + cfdata->read_offset;
		*avail = uavail - cfdata->read_offset;
		return (d);
	}

	if (!cab->entry_cffolder->decompress_init) {
		cab->stream.next_in = NULL;
		cab->stream.avail_in = 0;
		cab->stream.total_in = 0;
		cab->stream.next_out = NULL;
		cab->stream.avail_out = 0;
		cab->stream.total_out = 0;
		if (cab->stream_valid)
			r = inflateReset(&cab->stream);
		else
			r = inflateInit2(&cab->stream,
			    -15 /* Don't check for zlib header */);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize deflate decompression.");
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
		/* Stream structure has been set up. */
		cab->stream_valid = 1;
		/* We've initialized decompression for this stream. */
		cab->entry_cffolder->decompress_init = 1;
	}

	if (cfdata->compressed_bytes_remaining == cfdata->compressed_size)
		mszip = 2;
	else
		mszip = 0;
	eod = 0;
	cab->stream.total_out = uavail;
	/*
	 * We always uncompress all data in current CFDATA.
	 */
	while (!eod && cab->stream.total_out < cfdata->uncompressed_size) {
		ssize_t bytes_avail;

		cab->stream.next_out =
		    cab->uncompressed_buffer + cab->stream.total_out;
		cab->stream.avail_out =
		    cfdata->uncompressed_size - cab->stream.total_out;

		d = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			*avail = truncated_error(a);
			return (NULL);
		}
		if (bytes_avail > cfdata->compressed_bytes_remaining)
			bytes_avail = cfdata->compressed_bytes_remaining;
		/*
		 * A bug in zlib.h: stream.next_in should be marked 'const'
		 * but isn't (the library never alters data through the
		 * next_in pointer, only reads it).  The result: this ugly
		 * cast to remove 'const'.
		 */
		cab->stream.next_in = (Bytef *)(uintptr_t)d;
		cab->stream.avail_in = (uInt)bytes_avail;
		cab->stream.total_in = 0;

		/* Cut out a tow-byte MSZIP signature(0x43, 0x4b). */
		if (mszip > 0) {
			if (bytes_avail <= 0)
				goto nomszip;
			if (bytes_avail <= mszip) {
				if (mszip == 2) {
					if (cab->stream.next_in[0] != 0x43)
						goto nomszip;
					if (bytes_avail > 1 &&
					    cab->stream.next_in[1] != 0x4b)
						goto nomszip;
				} else if (cab->stream.next_in[0] != 0x4b)
					goto nomszip;
				cfdata->unconsumed = bytes_avail;
				cfdata->sum_ptr = d;
				if (cab_minimum_consume_cfdata(
				    a, cfdata->unconsumed) < 0) {
					*avail = ARCHIVE_FATAL;
					return (NULL);
				}
				mszip -= (int)bytes_avail;
				continue;
			}
			if (mszip == 1 && cab->stream.next_in[0] != 0x4b)
				goto nomszip;
			else if (mszip == 2 && (cab->stream.next_in[0] != 0x43 ||
			    cab->stream.next_in[1] != 0x4b))
				goto nomszip;
			cab->stream.next_in += mszip;
			cab->stream.avail_in -= mszip;
			cab->stream.total_in += mszip;
			mszip = 0;
		}

		r = inflate(&cab->stream, 0);
		switch (r) {
		case Z_OK:
			break;
		case Z_STREAM_END:
			eod = 1;
			break;
		default:
			goto zlibfailed;
		}
		cfdata->unconsumed = cab->stream.total_in;
		cfdata->sum_ptr = d;
		if (cab_minimum_consume_cfdata(a, cfdata->unconsumed) < 0) {
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}
	uavail = (uint16_t)cab->stream.total_out;

	if (uavail < cfdata->uncompressed_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid uncompressed size (%d < %d)",
		    uavail, cfdata->uncompressed_size);
		*avail = ARCHIVE_FATAL;
		return (NULL);
	}

	/*
	 * Note: I suspect there is a bug in makecab.exe because, in rare
	 * case, compressed bytes are still remaining regardless we have
	 * gotten all uncompressed bytes, which size is recorded in CFDATA,
	 * as much as we need, and we have to use the garbage so as to
	 * correctly compute the sum of CFDATA accordingly.
	 */
	if (cfdata->compressed_bytes_remaining > 0) {
		ssize_t bytes_avail;

		d = __archive_read_ahead(a, cfdata->compressed_bytes_remaining,
		    &bytes_avail);
		if (bytes_avail <= 0) {
			*avail = truncated_error(a);
			return (NULL);
		}
		cfdata->unconsumed = cfdata->compressed_bytes_remaining;
		cfdata->sum_ptr = d;
		if (cab_minimum_consume_cfdata(a, cfdata->unconsumed) < 0) {
			*avail = ARCHIVE_FATAL;
			return (NULL);
		}
	}

	/*
	 * Set dictionary data for decompressing of next CFDATA, which
	 * in the same folder. This is why we always do decompress CFDATA
	 * even if beginning CFDATA or some of CFDATA are not used in
	 * skipping file data.
	 */
	if (cab->entry_cffolder->cfdata_index <
	    cab->entry_cffolder->cfdata_count) {
		r = inflateReset(&cab->stream);
		if (r != Z_OK)
			goto zlibfailed;
		r = inflateSetDictionary(&cab->stream,
		    cab->uncompressed_buffer, cfdata->uncompressed_size);
		if (r != Z_OK)
			goto zlibfailed;
	}

	d = cab->uncompressed_buffer + cfdata->read_offset;
	*avail = uavail - cfdata->read_offset;
	cfdata->uncompressed_avail = uavail;

	return (d);

zlibfailed:
	switch (r) {
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for deflate decompression");
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Deflate decompression failed (%d)", r);
		break;
	}
	*avail = ARCHIVE_FATAL;
	return (NULL);
nomszip:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "CFDATA incorrect(no MSZIP signature)");
	*avail = ARCHIVE_FATAL;
	return (NULL);
}